

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get_metaonly(fdb_kvs_handle *handle,fdb_doc *doc)

{
  void *pvVar1;
  size_t __n;
  hbtrie *phVar2;
  long lVar3;
  docio_length len;
  ushort uVar4;
  undefined2 uVar5;
  ulong uVar6;
  bool bVar7;
  size_t sVar8;
  undefined1 *puVar9;
  void *__dest;
  undefined8 uStackY_120;
  undefined1 auStackY_118 [6];
  undefined2 uVar10;
  docio_object *in_stack_fffffffffffffef0;
  fdb_kvs_id_t local_108;
  size_t local_100;
  int64_t body_offset;
  bool alloced_meta;
  ulong uStack_f0;
  int size_chunk;
  fdb_doc doc_kv;
  _fdb_key_cmp_info cmp_info;
  fdb_txn *txn;
  hbtrie_result hr;
  fdb_status wr;
  filemgr *wal_file;
  docio_handle *dhandle;
  docio_object _doc;
  uint64_t offset;
  fdb_doc *doc_local;
  fdb_kvs_handle *handle_local;
  
  uVar10 = (undefined2)((uint)stack0xfffffffffffffeec >> 0x10);
  puVar9 = auStackY_118;
  uStackY_120 = 0x15b01c;
  docio_object::docio_object(in_stack_fffffffffffffef0);
  txn._0_4_ = HBTRIE_RESULT_FAIL;
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if (((((doc == (fdb_doc *)0x0) || (doc->key == (void *)0x0)) || (doc->keylen == 0)) ||
           (0xff80 < doc->keylen)) ||
          (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0 &&
           ((ulong)((handle->config).blocksize - 0x100) < doc->keylen)))) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else {
    uStackY_120 = 0x15b0ae;
    memcpy(&stack0xffffffffffffff10,doc,0x50);
    uVar5 = uVar10;
    uStackY_120 = 0x15b0c5;
    uVar4 = (ushort)uVar10 >> 8;
    bVar7 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffef0,(uint8_t)uVar4,
                               (uint8_t)uVar5);
    if (bVar7) {
      if (handle->kvs != (kvs_info *)0x0) {
        body_offset._4_4_ = (uint)(handle->config).chunksize;
        uStack_f0 = doc->keylen + (long)(int)body_offset._4_4_;
        lVar3 = -(uStack_f0 + 0xf & 0xfffffffffffffff0);
        puVar9 = auStackY_118 + lVar3;
        doc_kv.size_ondisk = (size_t)puVar9;
        *(undefined8 *)(auStackY_118 + lVar3 + -8) = 0x15b148;
        kvid2buf(*(size_t *)((long)&local_100 + lVar3),*(fdb_kvs_id_t *)((long)&local_108 + lVar3),
                 *(void **)(&stack0xfffffffffffffef0 + lVar3));
        __dest = (void *)(doc_kv.size_ondisk + (long)(int)body_offset._4_4_);
        pvVar1 = doc->key;
        __n = doc->keylen;
        *(undefined8 *)(auStackY_118 + lVar3 + -8) = 0x15b16d;
        memcpy(__dest,pvVar1,__n);
      }
      if (handle->shandle == (snap_handle *)0x0) {
        *(undefined8 *)(puVar9 + -8) = 0x15b188;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
      }
      doc_kv.deleted = (handle->kvs_config).create_if_missing;
      doc_kv._73_3_ = *(undefined3 *)&(handle->kvs_config).field_0x1;
      doc_kv.flags = *(uint32_t *)&(handle->kvs_config).field_0x4;
      if (((handle->config).do_not_search_wal & 1U) == 0) {
        if (handle->kvs == (kvs_info *)0x0) {
          *(undefined8 *)(puVar9 + -8) = 0x15b28b;
          txn._4_4_ = wal_find(*(fdb_txn **)(puVar9 + 0x30),*(filemgr **)(puVar9 + 0x28),
                               *(_fdb_key_cmp_info **)(puVar9 + 0x20),
                               *(snap_handle **)(puVar9 + 0x18),*(fdb_doc **)(puVar9 + 0x10),
                               *(uint64_t **)(puVar9 + 8));
        }
        else {
          *(undefined8 *)(puVar9 + -8) = 0x15b25f;
          txn._4_4_ = wal_find(*(fdb_txn **)(puVar9 + 0x30),*(filemgr **)(puVar9 + 0x28),
                               *(_fdb_key_cmp_info **)(puVar9 + 0x20),
                               *(snap_handle **)(puVar9 + 0x18),*(fdb_doc **)(puVar9 + 0x10),
                               *(uint64_t **)(puVar9 + 8));
        }
      }
      else {
        txn._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
      if (handle->shandle == (snap_handle *)0x0) {
        *(undefined8 *)(puVar9 + -8) = 0x15b2a7;
        fdb_sync_db_header(*(fdb_kvs_handle **)(puVar9 + 0xb0));
      }
      *(undefined8 *)(puVar9 + -8) = 0x15b2ba;
      atomic_incr_uint64_t(*(atomic<unsigned_long> **)(puVar9 + 8),*(memory_order *)(puVar9 + 4));
      if (txn._4_4_ == FDB_RESULT_KEY_NOT_FOUND) {
        *(undefined8 *)(puVar9 + -8) = 0x15b2cd;
        _fdb_sync_dirty_root(*(fdb_kvs_handle **)(puVar9 + 0x18));
        sVar8 = doc_kv.size_ondisk;
        uVar6 = uStack_f0;
        if (handle->kvs == (kvs_info *)0x0) {
          phVar2 = handle->trie;
          pvVar1 = doc->key;
          sVar8 = doc->keylen;
          *(undefined8 *)(puVar9 + -8) = 0x15b320;
          txn._0_4_ = hbtrie_find(phVar2,pvVar1,(int)sVar8,&_doc.body);
        }
        else {
          phVar2 = handle->trie;
          *(undefined8 *)(puVar9 + -8) = 0x15b2f9;
          txn._0_4_ = hbtrie_find(phVar2,(void *)sVar8,(int)uVar6,&_doc.body);
        }
        *(undefined8 *)(puVar9 + -8) = 0x15b330;
        btreeblk_end(*(btreeblk_handle **)(puVar9 + 0x10));
        _doc.body = (void *)((ulong)_doc.body >> 0x38 |
                             ((ulong)_doc.body & 0xff000000000000) >> 0x28 |
                             ((ulong)_doc.body & 0xff0000000000) >> 0x18 |
                             ((ulong)_doc.body & 0xff00000000) >> 8 |
                             ((ulong)_doc.body & 0xff000000) << 8 |
                             ((ulong)_doc.body & 0xff0000) << 0x18 |
                             ((ulong)_doc.body & 0xff00) << 0x28 | (long)_doc.body << 0x38);
        *(undefined8 *)(puVar9 + -8) = 0x15b3d9;
        _fdb_release_dirty_root(*(fdb_kvs_handle **)(puVar9 + 8));
      }
      if (((txn._4_4_ == FDB_RESULT_SUCCESS) && (_doc.body != (void *)0xffffffffffffffff)) ||
         ((hbtrie_result)txn == HBTRIE_RESULT_SUCCESS)) {
        if (handle->kvs == (kvs_info *)0x0) {
          _doc._16_8_ = doc->key;
          dhandle._0_2_ = (ushort)doc->keylen;
        }
        else {
          _doc._16_8_ = doc_kv.size_ondisk;
          dhandle._0_2_ = (ushort)uStack_f0;
        }
        body_offset._3_1_ = -(doc->meta == (void *)0x0) & 1;
        _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
        _doc.meta = doc->body;
        *(undefined8 *)(puVar9 + -8) = 0x15b470;
        local_100 = docio_read_doc_key_meta
                              (*(docio_handle **)(puVar9 + 0xe0),*(uint64_t *)(puVar9 + 0xd8),
                               *(docio_object **)(puVar9 + 0xd0),(bool)puVar9[0xcf]);
        if ((long)local_100 < 1) {
          *(undefined8 *)(puVar9 + -8) = 0x15b498;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar9 + 8),puVar9[7],puVar9[6]);
          if ((long)local_100 < 0) {
            register0x00000000 = (fdb_status)local_100;
          }
          else {
            stack0xfffffffffffffeec = FDB_RESULT_KEY_NOT_FOUND;
          }
          handle_local._4_4_ = stack0xfffffffffffffeec;
        }
        else if ((ushort)dhandle == uStack_f0) {
          doc->seqnum = (fdb_seqnum_t)_doc.key;
          doc->metalen = (ulong)dhandle._2_2_;
          doc->bodylen = (ulong)dhandle._4_4_;
          doc->meta = (void *)_doc.field_3;
          doc->body = _doc.meta;
          doc->deleted = (_doc.length.bodylen & 4) != 0;
          len.metalen = dhandle._2_2_;
          len.keylen = (ushort)dhandle;
          len.bodylen = dhandle._4_4_;
          len.flag = (undefined1)_doc.length.bodylen;
          len.checksum = _doc.length.bodylen._1_1_;
          len.reserved = _doc.length.bodylen._2_2_;
          len.bodylen_ondisk._0_2_ = _doc.length.keylen;
          len.bodylen_ondisk._2_2_ = _doc.length.metalen;
          *(undefined8 *)(puVar9 + -8) = 0x15b593;
          sVar8 = _fdb_get_docsize(len);
          doc->size_ondisk = sVar8;
          doc->offset = (uint64_t)_doc.body;
          *(undefined8 *)(puVar9 + -8) = 0x15b5c1;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar9 + 8),puVar9[7],puVar9[6]);
          handle_local._4_4_ = FDB_RESULT_SUCCESS;
        }
        else {
          *(undefined8 *)(puVar9 + -8) = 0x15b4f1;
          free_docio_object(*(docio_object **)(puVar9 + 8),puVar9[7],puVar9[6],puVar9[5]);
          *(undefined8 *)(puVar9 + -8) = 0x15b508;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar9 + 8),puVar9[7],puVar9[6]);
          handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
        }
      }
      else {
        *(undefined8 *)(puVar9 + -8) = 0x15b5e1;
        atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar9 + 8),puVar9[7],puVar9[6]);
        handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_metaonly(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    struct filemgr *wal_file = NULL;
    fdb_status wr;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    struct _fdb_key_cmp_info cmp_info;
    fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || !doc->key ||
        doc->keylen == 0 || doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    doc_kv = *doc;

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_kv.keylen = doc->keylen + size_chunk;
        doc_kv.key = alca(uint8_t, doc_kv.keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_kv.key);
        memcpy((uint8_t*)doc_kv.key + size_chunk, doc->key, doc->keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, &doc_kv,
                          &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc, &offset);
        }
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }
    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        if (handle->kvs) {
            hr = hbtrie_find(handle->trie, doc_kv.key, doc_kv.keylen,
                             (void *)&offset);
        } else {
            hr = hbtrie_find(handle->trie, doc->key, doc->keylen,
                             (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         hr == HBTRIE_RESULT_SUCCESS) {
        if (handle->kvs) {
            _doc.key = doc_kv.key;
            _doc.length.keylen = doc_kv.keylen;
        } else {
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
        }
        bool alloced_meta = doc->meta ? false : true;
        _doc.meta = doc->meta;
        _doc.body = doc->body;

        int64_t body_offset = docio_read_doc_key_meta(dhandle, offset, &_doc,
                                                       true);
        if (body_offset <= 0){
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return body_offset < 0 ? (fdb_status)body_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.keylen != doc_kv.keylen) {
            free_docio_object(&_doc, 0, alloced_meta, 0);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}